

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warshall.c
# Opt level: O1

void reflexive_transitive_closure(uint *R,int n)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  transitive_closure(R,n);
  iVar2 = n + 0x3e;
  if (-1 < n + 0x1f) {
    iVar2 = n + 0x1f;
  }
  iVar4 = n * (iVar2 >> 5);
  if (0 < iVar4) {
    puVar1 = R + iVar4;
    uVar3 = 1;
    do {
      *R = *R | uVar3;
      iVar4 = uVar3 * 2;
      uVar3 = iVar4 + (uint)(iVar4 == 0);
      R = R + (ulong)(iVar4 == 0) + (long)(iVar2 >> 5);
    } while (R < puVar1);
  }
  return;
}

Assistant:

void reflexive_transitive_closure(unsigned *R, int n)
{
    register int rowsize;
    register unsigned mask;
    register unsigned *rp;
    register unsigned *relend;

    transitive_closure(R, n);

    rowsize = WORDSIZE(n);
    relend = R + n*rowsize;

    mask = 1;
    rp = R;
    while (rp < relend)
    {
	*rp |= mask;
	mask <<= 1;
	if (mask == 0)
	{
	    mask = 1;
	    rp++;
	}

	rp += rowsize;
    }
}